

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

string * string_from_abi_cxx11_
                   (string *__return_storage_ptr__,vector<int,_std::allocator<int>_> *values)

{
  uint uVar1;
  uint *puVar2;
  uint __val;
  string *psVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  uint __len;
  uint *puVar8;
  string __str;
  stringstream buf;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[ ",2);
  puVar8 = (uint *)(values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  puVar2 = (uint *)(values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
  if (puVar8 != puVar2) {
    bVar5 = true;
    do {
      uVar1 = *puVar8;
      if (!bVar5) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
      }
      __val = -uVar1;
      if (0 < (int)uVar1) {
        __val = uVar1;
      }
      __len = 1;
      if (9 < __val) {
        uVar7 = (ulong)__val;
        uVar4 = 4;
        do {
          __len = uVar4;
          uVar6 = (uint)uVar7;
          if (uVar6 < 100) {
            __len = __len - 2;
            goto LAB_001f8c77;
          }
          if (uVar6 < 1000) {
            __len = __len - 1;
            goto LAB_001f8c77;
          }
          if (uVar6 < 10000) goto LAB_001f8c77;
          uVar7 = uVar7 / 10000;
          uVar4 = __len + 4;
        } while (99999 < uVar6);
        __len = __len + 1;
      }
LAB_001f8c77:
      local_1e0 = local_1d0;
      std::__cxx11::string::_M_construct((ulong)&local_1e0,(char)__len - (char)((int)uVar1 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_1e0 + (ulong)(uVar1 >> 0x1f)),__len,__val);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_1e0,local_1d8);
      if (local_1e0 != local_1d0) {
        operator_delete(local_1e0,local_1d0[0] + 1);
      }
      puVar8 = puVar8 + 1;
      bVar5 = false;
    } while (puVar8 != puVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ]",2);
  psVar3 = local_1c0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string string_from(const std::vector<int> & values) {
    std::stringstream buf;

    buf << "[ ";
    bool first = true;
    for (auto e : values) {
        if (first) {
            first = false;
        } else {
            buf << ", ";
        }
        buf << std::to_string(e);
    }
    buf << " ]";

    return buf.str();
}